

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raassignment_p.h
# Opt level: O2

void __thiscall
asmjit::v1_14::RAAssignment::initLayout
          (RAAssignment *this,RARegCount *physCount,RAWorkRegs *workRegs)

{
  uint uVar1;
  
  if (this->_physToWorkMap != (PhysToWorkMap *)0x0) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/../core/../core/raassignment_p.h"
               ,0x89,"_physToWorkMap == nullptr");
  }
  if (this->_workToPhysMap == (WorkToPhysMap *)0x0) {
    RARegIndex::buildIndexes((RARegIndex *)this,physCount);
    uVar1 = (physCount->field_0)._packed;
    (this->_layout).physCount.field_0._packed = uVar1;
    (this->_layout).physTotal =
         (uVar1 >> 0x18) + (uint)(this->_layout).physIndex.super_RARegCount.field_0._regs[3];
    (this->_layout).workCount = *(uint32_t *)(workRegs + 8);
    (this->_layout).workRegs = workRegs;
    return;
  }
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/../core/../core/raassignment_p.h"
             ,0x8a,"_workToPhysMap == nullptr");
}

Assistant:

ASMJIT_FORCE_INLINE void initLayout(const RARegCount& physCount, const RAWorkRegs& workRegs) noexcept {
    // Layout must be initialized before data.
    ASMJIT_ASSERT(_physToWorkMap == nullptr);
    ASMJIT_ASSERT(_workToPhysMap == nullptr);

    _layout.physIndex.buildIndexes(physCount);
    _layout.physCount = physCount;
    _layout.physTotal = uint32_t(_layout.physIndex[RegGroup::kMaxVirt]) +
                        uint32_t(_layout.physCount[RegGroup::kMaxVirt]) ;
    _layout.workCount = workRegs.size();
    _layout.workRegs = &workRegs;
  }